

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O0

char * findDirname(char *path,char *buffer,int32_t bufLen,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  char *basename;
  char *pcStack_38;
  int32_t resultLen;
  char *resultPtr;
  UErrorCode *status_local;
  int32_t bufLen_local;
  char *buffer_local;
  char *path_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    pcVar2 = strrchr(path,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcStack_38 = "";
      basename._4_4_ = 0;
    }
    else {
      basename._4_4_ = (int)pcVar2 - (int)path;
      pcStack_38 = path;
      if (basename._4_4_ < 1) {
        basename._4_4_ = 1;
      }
    }
    if (bufLen < basename._4_4_ + 1) {
      *status = U_BUFFER_OVERFLOW_ERROR;
      path_local = (char *)0x0;
    }
    else {
      strncpy(buffer,pcStack_38,(long)basename._4_4_);
      buffer[basename._4_4_] = '\0';
      path_local = buffer;
    }
  }
  else {
    path_local = (char *)0x0;
  }
  return path_local;
}

Assistant:

U_CAPI const char * U_EXPORT2
findDirname(const char *path, char *buffer, int32_t bufLen, UErrorCode* status) {
  if(U_FAILURE(*status)) return NULL;
  const char *resultPtr = NULL;
  int32_t resultLen = 0;

  const char *basename=uprv_strrchr(path, U_FILE_SEP_CHAR);
#if U_FILE_ALT_SEP_CHAR!=U_FILE_SEP_CHAR
  const char *basenameAlt=uprv_strrchr(path, U_FILE_ALT_SEP_CHAR);
  if(basenameAlt && (!basename || basename<basenameAlt)) {
    basename = basenameAlt;
  }
#endif
  if(!basename) {
    /* no basename - return ''. */
    resultPtr = "";
    resultLen = 0;
  } else {
    resultPtr = path;
    resultLen = basename - path;
    if(resultLen<1) {
      resultLen = 1; /* '/' or '/a' -> '/' */
    }
  }

  if((resultLen+1) <= bufLen) {
    uprv_strncpy(buffer, resultPtr, resultLen);
    buffer[resultLen]=0;
    return buffer;
  } else {
    *status = U_BUFFER_OVERFLOW_ERROR;
    return NULL;
  }
}